

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O3

void __thiscall
rtosc::AutomationMgr::setSlotSubPath(AutomationMgr *this,int slot,int ind,char *path)

{
  AutomationSlot *pAVar1;
  Automation *pAVar2;
  bool bVar3;
  Port *this_00;
  char *pcVar4;
  char *pcVar5;
  float fVar6;
  double dVar7;
  MetaContainer meta;
  MetaContainer local_58;
  MetaIterator local_50;
  MetaIterator local_40;
  
  if (slot < 0) {
    return;
  }
  if (this->nslots <= slot) {
    return;
  }
  this_00 = Ports::apropos(this->p,path);
  if (this_00 == (Port *)0x0) {
    fprintf(_stderr,"[Zyn:Error] port \'%s\' does not exist\n",path);
    return;
  }
  local_58 = Port::meta(this_00);
  local_40 = Port::MetaContainer::find(&local_58,"min");
  bVar3 = Port::MetaIterator::operator_cast_to_bool(&local_40);
  if (bVar3) {
    local_50 = Port::MetaContainer::find(&local_58,"max");
    bVar3 = Port::MetaIterator::operator_cast_to_bool(&local_50);
    if (!bVar3) goto LAB_0011252b;
  }
  else {
LAB_0011252b:
    pcVar4 = strstr(this_00->name,":T");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "No bounds for \'%s\' known\n";
      goto LAB_00112796;
    }
  }
  local_40 = Port::MetaContainer::find(&local_58,"internal");
  bVar3 = Port::MetaIterator::operator_cast_to_bool(&local_40);
  if (!bVar3) {
    local_50 = Port::MetaContainer::find(&local_58,"no learn");
    bVar3 = Port::MetaIterator::operator_cast_to_bool(&local_50);
    if (!bVar3) {
      pAVar1 = this->slots;
      pAVar1[(uint)slot].used = true;
      pAVar2 = pAVar1[(uint)slot].automations;
      pAVar2[ind].used = true;
      pAVar2[ind].active = true;
      pAVar2[ind].param_type = 'i';
      pcVar4 = this_00->name;
      pcVar5 = strstr(pcVar4,":f");
      if (pcVar5 == (char *)0x0) {
        pcVar4 = strstr(pcVar4,":T");
        if (pcVar4 == (char *)0x0) goto LAB_001125eb;
        pAVar2[ind].param_type = 'T';
        pAVar2[ind].param_min = 0.0;
        fVar6 = 1.0;
      }
      else {
        pAVar2[ind].param_type = 'f';
LAB_001125eb:
        pcVar4 = Port::MetaContainer::operator[](&local_58,"min");
        dVar7 = atof(pcVar4);
        pAVar2[ind].param_min = (float)dVar7;
        pcVar4 = Port::MetaContainer::operator[](&local_58,"max");
        dVar7 = atof(pcVar4);
        fVar6 = (float)dVar7;
      }
      pAVar2[ind].param_max = fVar6;
      fast_strcpy(pAVar2[ind].param_path,path,0x80);
      pcVar4 = Port::MetaContainer::operator[](&local_58,"scale");
      if (pcVar4 != (char *)0x0) {
        pcVar4 = Port::MetaContainer::operator[](&local_58,"scale");
        pcVar4 = strstr(pcVar4,"log");
        if (pcVar4 != (char *)0x0) {
          pAVar2[ind].map.control_scale = 1;
          pcVar4 = Port::MetaContainer::operator[](&local_58,"logmin");
          if (pcVar4 == (char *)0x0) {
            fVar6 = pAVar2[ind].param_min;
          }
          else {
            pcVar4 = Port::MetaContainer::operator[](&local_58,"logmin");
            dVar7 = atof(pcVar4);
            fVar6 = (float)dVar7;
          }
          fVar6 = logf(fVar6);
          pAVar2[ind].param_min = fVar6;
          fVar6 = logf(pAVar2[ind].param_max);
          pAVar2[ind].param_max = fVar6;
          goto LAB_00112726;
        }
      }
      pAVar2[ind].map.control_scale = 0;
LAB_00112726:
      updateMapping(this,slot,ind);
      this->damaged = 1;
      return;
    }
  }
  pcVar4 = "[Warning] port \'%s\' is unlearnable\n";
LAB_00112796:
  fprintf(_stderr,pcVar4,path);
  return;
}

Assistant:

void AutomationMgr::setSlotSubPath(int slot, int ind, const char *path)
{
    if(slot >= nslots || slot < 0)
        return;

    assert(p);
    const Port *port = p->apropos(path);
    if(!port) {
        fprintf(stderr, "[Zyn:Error] port '%s' does not exist\n", path);
        return;
    }
    auto meta = port->meta();
    if(!(meta.find("min") && meta.find("max"))) {
        if(!strstr(port->name, ":T")) {
            fprintf(stderr, "No bounds for '%s' known\n", path);
            return;
        }
    }
    if(meta.find("internal") || meta.find("no learn")) {
        fprintf(stderr, "[Warning] port '%s' is unlearnable\n", path);
        return;
    }

    slots[slot].used = true;

    auto &au = slots[slot].automations[ind];

    au.used   = true;
    au.active = true;
    au.param_type = 'i';
    if(strstr(port->name, ":f"))
        au.param_type = 'f';
    else if(strstr(port->name, ":T"))
        au.param_type = 'T';
    if(au.param_type == 'T') {
        au.param_min = 0.0;
        au.param_max = 1.0;
    } else {
        au.param_min = atof(meta["min"]);
        au.param_max = atof(meta["max"]);
    }
    fast_strcpy(au.param_path, path, sizeof(au.param_path));

    if(meta["scale"] && strstr(meta["scale"], "log")) {
        au.map.control_scale = 1;
        au.param_min = logf(meta["logmin"] ? atof(meta["logmin"]) : au.param_min);
        au.param_max = logf(au.param_max);
    } else
        au.map.control_scale = 0;

    updateMapping(slot, ind);
    damaged = true;
}